

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase367::run(TestCase367 *this)

{
  Builder builder_00;
  bool bVar1;
  undefined8 in_stack_fffffffffffffe20;
  bool local_1a1;
  undefined1 auStack_1a0 [7];
  bool _kj_shouldLog;
  size_t local_198;
  ArrayPtr<const_capnp::word> local_190;
  undefined1 local_180 [8];
  TestOutputStream output;
  Array<capnp::word> serialized;
  Builder local_130;
  undefined1 local_108 [8];
  TestMessageBuilder builder;
  TestCase367 *this_local;
  
  builder._240_8_ = this;
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_108,7);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_130,(MessageBuilder *)local_108);
  builder_00._builder.capTable = (CapTableBuilder *)local_130._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_130._builder.capTable;
  builder_00._builder.data = local_130._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_130._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffe20;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe20 >> 0x30);
  initTestMessage(builder_00);
  messageToFlatArray((Array<capnp::word> *)((long)&output.data.field_2 + 8),
                     (MessageBuilder *)local_108);
  TestOutputStream::TestOutputStream((TestOutputStream *)local_180);
  writeMessage((OutputStream *)local_180,(MessageBuilder *)local_108);
  _auStack_1a0 = kj::Array<capnp::word>::asPtr
                           ((Array<capnp::word> *)((long)&output.data.field_2 + 8));
  local_190 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)auStack_1a0);
  bVar1 = TestOutputStream::dataEquals((TestOutputStream *)local_180,local_190);
  if (!bVar1) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a1 != false) {
      kj::_::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-test.c++"
                 ,0x178,ERROR,"\"failed: expected \" \"output.dataEquals(serialized.asPtr())\"",
                 (char (*) [55])"failed: expected output.dataEquals(serialized.asPtr())");
      local_1a1 = false;
    }
  }
  TestOutputStream::~TestOutputStream((TestOutputStream *)local_180);
  kj::Array<capnp::word>::~Array((Array<capnp::word> *)((long)&output.data.field_2 + 8));
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_108);
  return;
}

Assistant:

TEST(Orphans, DynamicList) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56});
  EXPECT_TRUE(root.hasAnyPointerField());

  Orphan<DynamicList> orphan =
      root.getAnyPointerField().disownAs<DynamicList>(Schema::from<List<uint32_t>>());
  EXPECT_FALSE(orphan == nullptr);

  checkList<uint32_t>(orphan.getReader(), {12, 34, 56});
  EXPECT_FALSE(root.hasAnyPointerField());

  root.getAnyPointerField().adopt(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasAnyPointerField());
  checkList(root.asReader().getAnyPointerField().getAs<List<uint32_t>>(), {12u, 34u, 56u});

  Orphan<DynamicList> orphan2 = root.getAnyPointerField().disownAs<List<uint32_t>>();
  EXPECT_FALSE(orphan2 == nullptr);
  checkList<uint32_t>(orphan2.getReader(), {12, 34, 56});
}